

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O1

void __thiscall efsw::FileInfo::getRealInfo(FileInfo *this)

{
  bool bVar1;
  int iVar2;
  stat st;
  stat local_a0;
  
  bVar1 = FileSystem::slashAtEnd(&this->Filepath);
  if (bVar1) {
    FileSystem::dirRemoveSlashAtEnd(&this->Filepath);
  }
  iVar2 = lstat((this->Filepath)._M_dataplus._M_p,&local_a0);
  if (iVar2 == 0) {
    this->ModificationTime = local_a0.st_mtim.tv_sec;
    this->Size = local_a0.st_size;
    this->OwnerId = local_a0.st_uid;
    this->GroupId = local_a0.st_gid;
    this->Permissions = local_a0.st_mode;
    this->Inode = local_a0.st_ino;
  }
  if (bVar1) {
    FileSystem::dirAddSlashAtEnd(&this->Filepath);
    return;
  }
  return;
}

Assistant:

void FileInfo::getRealInfo()
{
	bool slashAtEnd = FileSystem::slashAtEnd( Filepath );

	if ( slashAtEnd )
	{
		FileSystem::dirRemoveSlashAtEnd( Filepath );
	}

	#if EFSW_PLATFORM != EFSW_PLATFORM_WIN32
	struct stat st;
	int res = lstat( Filepath.c_str(), &st );
	#else
	struct _stat st;
	int res = _wstat( String::fromUtf8( Filepath ).toWideString().c_str(), &st );
	#endif

	if ( 0 == res )
	{
		ModificationTime	= st.st_mtime;
		Size				= st.st_size;
		OwnerId				= st.st_uid;
		GroupId				= st.st_gid;
		Permissions			= st.st_mode;
		Inode				= st.st_ino;
	}

	if ( slashAtEnd )
	{
		FileSystem::dirAddSlashAtEnd( Filepath );
	}
}